

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

_Bool test_matches_pattern(char *symbolic_name_pattern,TestItem *test_item)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = strchr(symbolic_name_pattern,0x3a);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)string_dup("default");
  }
  else {
    pcVar3 = (char *)string_dup(symbolic_name_pattern);
    pcVar4 = strchr(pcVar3,0x3a);
    *pcVar4 = '\0';
  }
  iVar1 = fnmatch(pcVar3,test_item->context_name,0);
  pcVar4 = test_name_of(symbolic_name_pattern);
  iVar2 = fnmatch(pcVar4,test_item->test_name,0);
  free(pcVar3);
  free(pcVar4);
  return iVar2 == 0 && iVar1 == 0;
}

Assistant:

static bool test_matches_pattern(const char *symbolic_name_pattern,
                                 TestItem *test_item) {
    char* context_name = context_name_of(symbolic_name_pattern);
    int context_name_matches_test = fnmatch(context_name, test_item->context_name, 0) == 0;
    char* test_name = test_name_of(symbolic_name_pattern);
    int test_name_matches_test = fnmatch(test_name, test_item->test_name, 0) == 0;

    free(context_name);
    free(test_name);

    return context_name_matches_test && test_name_matches_test;
}